

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_bigint.h
# Opt level: O0

uint32_t __thiscall absl::strings_internal::BigUnsigned<84>::DivMod<10u>(BigUnsigned<84> *this)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  bool bVar3;
  int i;
  uint64_t accumulator;
  BigUnsigned<84> *this_local;
  
  accumulator = 0;
  i = this->size_;
  while (i = i + -1, -1 < i) {
    uVar2 = (ulong)this->words_[i] + (accumulator << 0x20);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar2;
    this->words_[i] = SUB164(auVar1 / ZEXT816(10),0);
    accumulator = uVar2 % 10;
  }
  while( true ) {
    bVar3 = false;
    if (0 < this->size_) {
      bVar3 = this->words_[this->size_ + -1] == 0;
    }
    if (!bVar3) break;
    this->size_ = this->size_ + -1;
  }
  return (uint32_t)accumulator;
}

Assistant:

uint32_t DivMod() {
    uint64_t accumulator = 0;
    for (int i = size_ - 1; i >= 0; --i) {
      accumulator <<= 32;
      accumulator += words_[i];
      // accumulator / divisor will never overflow an int32_t in this loop
      words_[i] = static_cast<uint32_t>(accumulator / divisor);
      accumulator = accumulator % divisor;
    }
    while (size_ > 0 && words_[size_ - 1] == 0) {
      --size_;
    }
    return static_cast<uint32_t>(accumulator);
  }